

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SigmoidKernel::SigmoidKernel(SigmoidKernel *this,SigmoidKernel *from)

{
  ulong uVar1;
  double dVar2;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SigmoidKernel_0048ea98;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  dVar2 = from->c_;
  this->gamma_ = from->gamma_;
  this->c_ = dVar2;
  return;
}

Assistant:

SigmoidKernel::SigmoidKernel(const SigmoidKernel& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&gamma_, &from.gamma_,
    static_cast<size_t>(reinterpret_cast<char*>(&c_) -
    reinterpret_cast<char*>(&gamma_)) + sizeof(c_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SigmoidKernel)
}